

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

Byte ppmd_read(void *p)

{
  Byte *pBVar1;
  void *pvVar2;
  uint8_t *data;
  ssize_t bytes_avail;
  long lStack_28;
  Byte b;
  _7zip *zip;
  archive_read *a;
  void *p_local;
  
  zip = *p;
  lStack_28 = **(long **)(zip->ppmd7_context).See[3];
  if (*(long *)(lStack_28 + 0x4de0) < 1) {
    data = (uint8_t *)0x0;
    a = (archive_read *)p;
    pvVar2 = __archive_read_ahead
                       ((archive_read *)zip,*(long *)(lStack_28 + 0x4df0) + 1,(ssize_t *)&data);
    if ((long)data < *(long *)(lStack_28 + 0x4df0) + 1) {
      archive_set_error((archive *)zip,0x54,"Truncated 7z file data");
      *(undefined4 *)(lStack_28 + 0x4e10) = 1;
      return '\0';
    }
    *(long *)(lStack_28 + 0x4dd8) = *(long *)(lStack_28 + 0x4dd8) + 1;
    bytes_avail._7_1_ = *(Byte *)((long)pvVar2 + *(long *)(lStack_28 + 0x4df0));
  }
  else {
    pBVar1 = *(Byte **)(lStack_28 + 0x4dd8);
    *(Byte **)(lStack_28 + 0x4dd8) = pBVar1 + 1;
    bytes_avail._7_1_ = *pBVar1;
  }
  *(long *)(lStack_28 + 0x4de0) = *(long *)(lStack_28 + 0x4de0) + -1;
  *(long *)(lStack_28 + 0x4de8) = *(long *)(lStack_28 + 0x4de8) + 1;
  *(long *)(lStack_28 + 0x4df0) = *(long *)(lStack_28 + 0x4df0) + 1;
  return bytes_avail._7_1_;
}

Assistant:

static Byte
ppmd_read(void *p)
{
	struct archive_read *a = ((IByteIn*)p)->a;
	struct _7zip *zip = (struct _7zip *)(a->format->data);
	Byte b;

	if (zip->ppstream.avail_in <= 0) {
		/*
		 * Ppmd7_DecodeSymbol might require reading multiple bytes
		 * and we are on boundary;
		 * last resort to read using __archive_read_ahead.
		 */
		ssize_t bytes_avail = 0;
		const uint8_t* data = __archive_read_ahead(a,
		    zip->ppstream.stream_in+1, &bytes_avail);
		if(bytes_avail < zip->ppstream.stream_in+1) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7z file data");
			zip->ppstream.overconsumed = 1;
			return (0);
		}
		zip->ppstream.next_in++;
		b = data[zip->ppstream.stream_in];
	} else {
		b = *zip->ppstream.next_in++;
	}
	zip->ppstream.avail_in--;
	zip->ppstream.total_in++;
	zip->ppstream.stream_in++;
	return (b);
}